

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<double,_1000>::TPZManVector
          (TPZManVector<double,_1000> *this,TPZManVector<double,_1000> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  int64_t i;
  int64_t size;
  long local_30;
  
  TPZVec<double>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_02564890;
  uVar2 = TPZVec<double>::NElements(in_RSI);
  if ((long)uVar2 < 0x3e9) {
    in_RDI->fStore = (double *)(in_RDI + 1);
    in_RDI->fNElements = uVar2;
    in_RDI->fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    in_RDI->fStore = pdVar4;
    in_RDI->fNElements = uVar2;
    in_RDI->fNAlloc = uVar2;
  }
  for (local_30 = 0; local_30 < (long)uVar2; local_30 = local_30 + 1) {
    in_RDI->fStore[local_30] = in_RSI->fStore[local_30];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}